

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::AggregateInitialiserList::~AggregateInitialiserList(AggregateInitialiserList *this)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__AggregateInitialiserList_002d02b8;
  (this->items).numActive = 0;
  if (4 < (this->items).numAllocated) {
    ppVar1 = (this->items).items;
    if (ppVar1 != (pool_ref<soul::heart::Expression> *)0x0) {
      operator_delete__(ppVar1);
    }
    (this->items).items = (pool_ref<soul::heart::Expression> *)(this->items).space;
    (this->items).numAllocated = 4;
  }
  RefCountedPtr<soul::Structure>::decIfNotNull((this->type).structure.object);
  Object::~Object((Object *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}